

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O1

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetEyeTrackerGlobalPosition
          (VClient *this,uint i_EyeTrackerID,double (*o_rThreeVector) [3],bool *o_rbOccludedFlag)

{
  pointer pVVar1;
  pointer pVVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  UInt32 *pUVar6;
  ulong uVar7;
  Enum EVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  Enum GetResult;
  scoped_lock Lock;
  array<double,_3UL> WorldTranslation;
  array<double,_3UL> WorldEyeTranslation;
  array<double,_3UL> EyeTranslation;
  array<double,_9UL> WorldRotation;
  Enum local_ec;
  unique_lock<boost::recursive_mutex> local_e8;
  array<double,_3UL> local_d8;
  array<double,_3UL> local_c0;
  double local_a8 [3];
  array<double,_3UL> local_90;
  array<double,_9UL> local_78;
  
  local_e8.m = &this->m_FrameMutex;
  local_e8.is_locked = false;
  boost::unique_lock<boost::recursive_mutex>::lock(&local_e8);
  local_ec = Success;
  bVar3 = InitGet<double[3],bool>(this,&local_ec,o_rThreeVector,o_rbOccludedFlag);
  EVar8 = local_ec;
  if (bVar3) {
    pVVar1 = (this->m_LatestFrame).m_EyeTrackers.
             super__Vector_base<ViconCGStream::VEyeTrackerInfo,_std::allocator<ViconCGStream::VEyeTrackerInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = (long)(this->m_LatestFrame).m_EyeTrackers.
                  super__Vector_base<ViconCGStream::VEyeTrackerInfo,_std::allocator<ViconCGStream::VEyeTrackerInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1;
    if (lVar5 == 0) {
      lVar5 = -1;
    }
    else {
      lVar4 = (lVar5 >> 3) * -0x71c71c71c71c71c7;
      pUVar6 = &pVVar1->m_DeviceID;
      lVar5 = -1;
      lVar9 = 0;
      do {
        if (*pUVar6 == i_EyeTrackerID) {
          lVar5 = lVar9;
        }
        lVar9 = lVar9 + 1;
        pUVar6 = pUVar6 + 0x12;
      } while (lVar4 + (ulong)(lVar4 == 0) != lVar9);
    }
    if (lVar5 == -1) {
      EVar8 = InvalidIndex;
    }
    else {
      pVVar2 = (this->m_LatestFrame).m_GlobalSegments.
               super__Vector_base<ViconCGStream::VGlobalSegments,_std::allocator<ViconCGStream::VGlobalSegments>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = (long)(this->m_LatestFrame).m_GlobalSegments.
                    super__Vector_base<ViconCGStream::VGlobalSegments,_std::allocator<ViconCGStream::VGlobalSegments>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2;
      if (lVar4 != 0) {
        uVar7 = (lVar4 >> 3) * -0x3333333333333333;
        uVar10 = 0;
        do {
          if (pVVar2[uVar10].m_SubjectID == pVVar1[lVar5].m_SubjectID) {
            lVar4 = *(long *)&pVVar2[uVar10].m_Segments.
                              super__Vector_base<ViconCGStreamDetail::VGlobalSegments_Segment,_std::allocator<ViconCGStreamDetail::VGlobalSegments_Segment>_>
                              ._M_impl.super__Vector_impl_data;
            lVar9 = (long)*(pointer *)
                           ((long)&pVVar2[uVar10].m_Segments.
                                   super__Vector_base<ViconCGStreamDetail::VGlobalSegments_Segment,_std::allocator<ViconCGStreamDetail::VGlobalSegments_Segment>_>
                                   ._M_impl + 8) - lVar4;
            if (lVar9 != 0) {
              uVar11 = (lVar9 >> 3) * 0x4ec4ec4ec4ec4ec5;
              uVar12 = 1;
              uVar13 = 0;
LAB_0012d2d5:
              if (*(UInt32 *)(lVar4 + uVar13 * 0x68) != pVVar1[lVar5].m_SegmentID)
              goto code_r0x0012d2e0;
              lVar4 = lVar4 + uVar13 * 0x68;
              memmove(&local_78,(void *)(lVar4 + 0x20),0x48);
              local_d8._M_elems[0] = *(double *)(lVar4 + 8);
              local_d8._M_elems[1] = *(double *)(lVar4 + 0x10);
              local_d8._M_elems[2] = *(double *)(lVar4 + 0x18);
              uVar7 = 4;
              lVar4 = 0;
              do {
                *(double *)((long)local_90._M_elems + lVar4 * 2) =
                     (double)*(float *)((long)pVVar1[lVar5].m_LocalTranslation + lVar4);
                uVar7 = uVar7 - 1;
                lVar4 = lVar4 + 4;
              } while (1 < uVar7);
              ClientUtils::operator*(&local_c0,&local_78,&local_90);
              ClientUtils::operator+(&local_c0,&local_d8);
              CopyAndTransformT(this,local_a8,o_rThreeVector);
              goto LAB_0012d390;
            }
          }
LAB_0012d2eb:
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (uVar10 <= uVar7 && uVar7 - uVar10 != 0);
      }
      *o_rbOccludedFlag = true;
LAB_0012d390:
      EVar8 = Success;
    }
  }
  if (local_e8.is_locked == true) {
    boost::recursive_mutex::unlock(local_e8.m);
  }
  return EVar8;
code_r0x0012d2e0:
  uVar13 = (ulong)uVar12;
  uVar12 = uVar12 + 1;
  if (uVar11 < uVar13 || uVar11 - uVar13 == 0) goto LAB_0012d2eb;
  goto LAB_0012d2d5;
}

Assistant:

Result::Enum VClient::GetEyeTrackerGlobalPosition( const unsigned int i_EyeTrackerID, double (&o_rThreeVector)[3], bool& o_rbOccludedFlag ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  
  Result::Enum GetResult = Result::Success;
  if ( !InitGet( GetResult, o_rThreeVector, o_rbOccludedFlag ) )
  {
    return GetResult; 
  }

  size_t EyeTrackerIndex = -1;

  for( size_t i = 0; i < m_LatestFrame.m_EyeTrackers.size(); i++ )
  {
    if( m_LatestFrame.m_EyeTrackers[ i ].m_DeviceID == i_EyeTrackerID )
    {
      EyeTrackerIndex = i;
    }
  }

  if( EyeTrackerIndex == BadIndex )
  {
    return Result::InvalidIndex;
  }

  const ViconCGStream::VEyeTrackerInfo & rEyeTracker = m_LatestFrame.m_EyeTrackers[ EyeTrackerIndex ];

  // Look up the ids for the subject and segment
  unsigned int SubjectID = rEyeTracker.m_SubjectID;
  unsigned int SegmentID = rEyeTracker.m_SegmentID;

  // go through the frame's segment data and find its position in this frame
  for( unsigned int i = 0; i < m_LatestFrame.m_GlobalSegments.size(); i++ )
  {
    const ViconCGStream::VGlobalSegments& rSegments = m_LatestFrame.m_GlobalSegments[i];
    if( rSegments.m_SubjectID == SubjectID )
    {
      // now look through its segments
      for( unsigned int j = 0; j < rSegments.m_Segments.size(); j++ )
      {
        const ViconCGStreamDetail::VGlobalSegments_Segment& rSegment = rSegments.m_Segments[j];
        if( rSegment.m_SegmentID == SegmentID )
        {
          // Use the segment to calculate global eye location.

          std::array< double, 3 * 3 > WorldRotation;
          std::copy( rSegment.m_Rotation, rSegment.m_Rotation + 9, WorldRotation.begin() );

          std::array< double, 3 > WorldTranslation;
          std::copy( rSegment.m_Translation, rSegment.m_Translation + 3, WorldTranslation.begin() );

          std::array< double, 3 > EyeTranslation;
          std::copy( rEyeTracker.m_LocalTranslation, rEyeTracker.m_LocalTranslation + 3, EyeTranslation.begin() );

          const std::array< double, 3 > WorldEyeTranslation = WorldRotation * EyeTranslation + WorldTranslation;

          CopyAndTransformT( WorldEyeTranslation.data(), o_rThreeVector );
          return Result::Success;
        }       
      }
    }
  }

  // If we fail to find the segment it is probably just failed to fit.
  // We mark this as an occluded success.

  o_rbOccludedFlag = true;
  return Result::Success;
}